

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

void __thiscall vkt::ubo::VarType::VarType(VarType *this,VarType *elementType,int arraySize)

{
  VarType *this_00;
  
  this->m_type = TYPE_ARRAY;
  this->m_flags = 0;
  (this->m_data).array.elementType = (VarType *)0x0;
  (this->m_data).array.size = arraySize;
  this_00 = (VarType *)operator_new(0x18);
  this_00->m_type = TYPE_LAST;
  *(undefined8 *)&this_00->m_flags = 0;
  *(undefined8 *)((long)&(this_00->m_data).array.elementType + 4) = 0;
  operator=(this_00,elementType);
  (this->m_data).array.elementType = this_00;
  return;
}

Assistant:

VarType::VarType (const VarType& elementType, int arraySize)
	: m_type	(TYPE_ARRAY)
	, m_flags	(0)
{
	m_data.array.size			= arraySize;
	m_data.array.elementType	= new VarType(elementType);
}